

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>
cppcms::crypto::cbc::create(cbc_type type)

{
  unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_> *this;
  pointer __p;
  int in_ESI;
  __uniq_ptr_data<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>,_true,_true> in_RDI;
  uint in_stack_0000001c;
  openssl_aes_encryptor *in_stack_00000020;
  unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_> *res;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>
  *in_stack_ffffffffffffffc0;
  
  std::unique_ptr<cppcms::crypto::cbc,std::default_delete<cppcms::crypto::cbc>>::
  unique_ptr<std::default_delete<cppcms::crypto::cbc>,void>(in_stack_ffffffffffffffc0);
  if (in_ESI == 0) {
    operator_new(0x228);
    openssl_aes_encryptor::openssl_aes_encryptor(in_stack_00000020,in_stack_0000001c);
    std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::reset
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else if (in_ESI == 1) {
    this = (unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_> *)
           operator_new(0x228);
    openssl_aes_encryptor::openssl_aes_encryptor(in_stack_00000020,in_stack_0000001c);
    std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::reset
              (this,in_stack_ffffffffffffffb8);
  }
  else if (in_ESI == 2) {
    __p = (pointer)operator_new(0x228);
    openssl_aes_encryptor::openssl_aes_encryptor(in_stack_00000020,in_stack_0000001c);
    std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::reset
              (in_stack_ffffffffffffffc0,__p);
  }
  return (__uniq_ptr_data<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>,_true,_true>
         )(tuple<cppcms::crypto::cbc_*,_std::default_delete<cppcms::crypto::cbc>_>)
          in_RDI.
          super___uniq_ptr_impl<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>._M_t
          .super__Tuple_impl<0UL,_cppcms::crypto::cbc_*,_std::default_delete<cppcms::crypto::cbc>_>.
          super__Head_base<0UL,_cppcms::crypto::cbc_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cbc> cbc::create(cbc::cbc_type type)
{
	std::unique_ptr<cbc> res;
	switch(type) {
#ifdef CPPCMS_HAVE_AES
	case aes128:
		res.reset(new aes_encryption_provider(128));
		break;
	case aes192:
		res.reset(new aes_encryption_provider(192));
		break;
	case aes256:
		res.reset(new aes_encryption_provider(256));
		break;
#endif
	default:
		;
	}
	return res;
}